

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_osc.c
# Opt level: O3

t_int * noise_perform(t_int *w)

{
  uint *puVar1;
  t_int tVar2;
  long lVar3;
  long lVar4;
  uint uVar5;
  
  puVar1 = (uint *)w[2];
  tVar2 = w[3];
  uVar5 = *puVar1;
  if ((int)tVar2 != 0) {
    lVar3 = w[1];
    lVar4 = 0;
    do {
      *(float *)(lVar3 + lVar4 * 4) = (float)(int)((uVar5 & 0x7fffffff) + 0xc0000000) * 9.313226e-10
      ;
      uVar5 = uVar5 * 0x19fb4787 + 0x16d1b86b;
      lVar4 = lVar4 + 1;
    } while ((int)tVar2 != (int)lVar4);
  }
  *puVar1 = uVar5;
  return w + 4;
}

Assistant:

static t_int *noise_perform(t_int *w)
{
    t_sample *out = (t_sample *)(w[1]);
    int *vp = (int *)(w[2]);
    int n = (int)(w[3]);
    int val = *vp;
    while (n--)
    {
        *out++ = ((t_sample)((val & 0x7fffffff) - 0x40000000)) *
            (t_sample)(1.0 / 0x40000000);
        val = val * 435898247 + 382842987;
    }
    *vp = val;
    return (w+4);
}